

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O2

void Js::ByteCodeDumper::Dump(FunctionBody *dumpFunction)

{
  int *this;
  ushort uVar1;
  code *pcVar2;
  byte *pbVar3;
  int iVar4;
  FunctionBody *pFVar5;
  bool bVar6;
  byte bVar7;
  OpCode op;
  uint uVar8;
  uint uVar9;
  RegSlot RVar10;
  RegSlot RVar11;
  RegSlot RVar12;
  undefined4 *puVar13;
  byte *pbVar14;
  ByteBlock *this_00;
  char16_t *pcVar15;
  int i;
  int i_00;
  ulong uVar16;
  ArgSlot paramIndex;
  uint uVar17;
  undefined1 auStack_98 [8];
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  statementReader;
  ByteCodeReader reader;
  LayoutSize local_40;
  uint32 local_3c;
  LayoutSize layoutSize;
  
  ByteCodeReader::Create((ByteCodeReader *)&statementReader.m_statementIndex,dumpFunction,0);
  auStack_98 = (undefined1  [8])0x0;
  statementReader.m_startLocation = (byte *)0x0;
  statementReader.m_statementMap._0_4_ = 0xffffffff;
  statementReader._12_8_ = 0;
  statementReader.m_statementMapIter.accumulatedSourceBegin = 0;
  statementReader.m_statementMapIter.accumulatedBytecodeBegin = 0;
  statementReader.m_statementMapIter.indexOfActualOffset = 0;
  statementReader.m_fullstatementMap._0_4_ = 0;
  statementReader.m_fullstatementMap._4_4_ = 0;
  statementReader.m_nextStatementBoundary._0_4_ = 0;
  statementReader.m_nextStatementBoundary._4_1_ = 1;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::Create((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
            *)auStack_98,dumpFunction,0);
  FunctionBody::DumpFullFunctionName(dumpFunction);
  Output::Print(L" (");
  uVar1 = (dumpFunction->super_ParseableFunctionInfo).m_inParamCount;
  _layoutSize = dumpFunction;
  for (uVar17 = 0; uVar1 != uVar17; uVar17 = uVar17 + 1) {
    if (uVar17 != 0) {
      Output::Print(L", ");
    }
    Output::Print(L"In%hu",(ulong)uVar17);
  }
  Output::Print(L") ");
  pFVar5 = _layoutSize;
  uVar8 = FunctionBody::GetByteCodeCount(_layoutSize);
  uVar9 = FunctionBody::GetByteCodeWithoutLDACount(pFVar5);
  Output::Print(L"(size: %d [%d])\n",(ulong)uVar8,(ulong)uVar9);
  bVar6 = FunctionProxy::IsInDebugMode((FunctionProxy *)pFVar5);
  if (bVar6) {
    Output::Print(L"[Bytecode was generated for debug mode]\n");
  }
  if (((_layoutSize->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) != 0) {
    Output::Print(L"[A reparse is being done]\n");
  }
  pFVar5 = _layoutSize;
  RVar10 = FunctionBody::GetLocalsCount(_layoutSize);
  RVar11 = FunctionBody::GetTempCount(pFVar5);
  RVar12 = FunctionBody::GetFirstTmpReg(pFVar5);
  uVar8 = FunctionBody::GetInlineCacheCount(pFVar5);
  Output::Print(L"      %u locals (%u temps from R%u), %u inline cache\n",(ulong)RVar10,
                (ulong)RVar11,(ulong)RVar12,(ulong)uVar8);
  DumpConstantTable(pFVar5);
  DumpImplicitArgIns(pFVar5);
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this = &statementReader.m_statementIndex;
  local_3c = 0;
  while( true ) {
    while( true ) {
      pbVar3 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                                statementReader.m_fullstatementMap._0_4_);
      pbVar14 = ByteCodeReader::GetIP((ByteCodeReader *)this);
      if (pbVar3 != pbVar14) break;
      FunctionBody::PrintStatementSourceLine(_layoutSize,local_3c);
      local_3c = StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                 ::MoveNextStatementBoundary
                           ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                             *)auStack_98);
    }
    uVar8 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
    op = ByteCodeReader::ReadOp((ByteCodeReader *)this,&local_40);
    if (op == EndOfBlock) break;
    pcVar15 = L"";
    if (local_40 == MediumLayout) {
      pcVar15 = L"M-";
    }
    if (local_40 == LargeLayout) {
      pcVar15 = L"L-";
    }
    Output::Print(L"    %04x %2s",(ulong)uVar8,pcVar15);
    DumpOp(op,local_40,(ByteCodeReader *)this,_layoutSize);
    if (DAT_0145948a == '\x01') {
      i_00 = uVar8 + 2;
      uVar9 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)this);
      Output::SkipToColumn(0x46);
      if (local_40 == SmallLayout) {
LAB_00747c7a:
        if (MaxByteSizedOpcodes < op) {
          uVar16 = 1;
          goto LAB_00747c8c;
        }
        Output::Print(L"   ");
        i_00 = uVar8 + 1;
      }
      else {
        if (local_40 == MediumLayout) {
          iVar4 = 2;
        }
        else {
          if (local_40 != LargeLayout) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar13 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                        ,0x6a,"(layoutSize == SmallLayout)",
                                        "layoutSize == SmallLayout");
            if (bVar6) {
              *puVar13 = 0;
              goto LAB_00747c7a;
            }
            goto LAB_00747dba;
          }
          iVar4 = 4;
        }
        uVar16 = (ulong)((iVar4 + 1) - (uint)(op < InvalidOpCode));
LAB_00747c8c:
        Output::Print(L"%02X ",uVar16);
      }
      Output::Print(L"%02x",(ulong)(byte)op);
      for (; i_00 < (int)uVar9; i_00 = i_00 + 1) {
        bVar7 = ByteCodeReader::GetRawByte((ByteCodeReader *)this,i_00);
        Output::Print(L" %02x",(ulong)bVar7);
      }
    }
    Output::Print(L"\n");
  }
  uVar8 = ByteCodeReader::GetCurrentOffset((ByteCodeReader *)&statementReader.m_statementIndex);
  this_00 = FunctionBody::GetByteCode(_layoutSize);
  uVar9 = ByteBlock::GetLength(this_00);
  if (uVar8 != uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x52,
                                "(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength())"
                                ,
                                "reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength()"
                               );
    if (!bVar6) {
LAB_00747dba:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar13 = 0;
  }
  pbVar3 = (byte *)CONCAT44(statementReader.m_fullstatementMap._4_4_,
                            statementReader.m_fullstatementMap._0_4_);
  pbVar14 = ByteCodeReader::GetIP((ByteCodeReader *)&statementReader.m_statementIndex);
  if (pbVar3 == pbVar14) {
    FunctionBody::PrintStatementSourceLine(_layoutSize,local_3c);
    StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::MoveNextStatementBoundary
              ((StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
                *)auStack_98);
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void ByteCodeDumper::Dump(FunctionBody* dumpFunction)
    {
        ByteCodeReader reader;
        reader.Create(dumpFunction);
        StatementReader<FunctionBody::StatementMapList> statementReader;
        statementReader.Create(dumpFunction);
        dumpFunction->DumpFullFunctionName();
        Output::Print(_u(" ("));
        ArgSlot inParamCount = dumpFunction->GetInParamsCount();
        for (ArgSlot paramIndex = 0; paramIndex < inParamCount; paramIndex++)
        {
            if (paramIndex > 0)
            {
                Output::Print(_u(", "));
            }
            Output::Print(_u("In%hu"), paramIndex);
        }
        Output::Print(_u(") "));
        Output::Print(_u("(size: %d [%d])\n"), dumpFunction->GetByteCodeCount(), dumpFunction->GetByteCodeWithoutLDACount());
#if defined(DBG) || defined(ENABLE_DEBUG_CONFIG_OPTIONS)
        if (dumpFunction->IsInDebugMode())
        {
            Output::Print(_u("[Bytecode was generated for debug mode]\n"));
        }
#endif
#if DBG
        if (dumpFunction->IsReparsed())
        {
            Output::Print(_u("[A reparse is being done]\n"));
        }
#endif
        Output::Print(
            _u("      %u locals (%u temps from R%u), %u inline cache\n"),
            dumpFunction->GetLocalsCount(),
            dumpFunction->GetTempCount(),
            dumpFunction->GetFirstTmpReg(),
            dumpFunction->GetInlineCacheCount());
        uint32 statementIndex = 0;
        ByteCodeDumper::DumpConstantTable(dumpFunction);
        ByteCodeDumper::DumpImplicitArgIns(dumpFunction);
        while (true)
        {
            while (statementReader.AtStatementBoundary(&reader))
            {
                dumpFunction->PrintStatementSourceLine(statementIndex);
                statementIndex = statementReader.MoveNextStatementBoundary();
            }
            uint byteOffset = reader.GetCurrentOffset();
            LayoutSize layoutSize;
            OpCode op = reader.ReadOp(layoutSize);
            if (op == OpCode::EndOfBlock)
            {
                Assert(reader.GetCurrentOffset() == dumpFunction->GetByteCode()->GetLength());
                break;
            }
            Output::Print(_u("    %04x %2s"), byteOffset, layoutSize == LargeLayout? _u("L-") : layoutSize == MediumLayout? _u("M-") : _u(""));
            DumpOp(op, layoutSize, reader, dumpFunction);
            if (Js::Configuration::Global.flags.Verbose)
            {
                int layoutStart = byteOffset + 2; // Account fo the prefix op
                int endByteOffset = reader.GetCurrentOffset();
                Output::SkipToColumn(70);
                if (layoutSize == LargeLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedLargeLayoutPrefix : Js::OpCode::LargeLayoutPrefix);
                }
                else if (layoutSize == MediumLayout)
                {
                    Output::Print(_u("%02X "),
                        op > Js::OpCode::MaxByteSizedOpcodes?
                            Js::OpCode::ExtendedMediumLayoutPrefix : Js::OpCode::MediumLayoutPrefix);
                }
                else
                {
                    Assert(layoutSize == SmallLayout);
                    if (op > Js::OpCode::MaxByteSizedOpcodes)
                    {
                        Output::Print(_u("%02X "), Js::OpCode::ExtendedOpcodePrefix);
                    }
                    else
                    {
                        Output::Print(_u("   "));
                        layoutStart--; // don't have a prefix
                    }
                }

                Output::Print(_u("%02x"), (byte)op);
                for (int i = layoutStart; i < endByteOffset; i++)
                {
                    Output::Print(_u(" %02x"), reader.GetRawByte(i));
                }
            }
            Output::Print(_u("\n"));
        }
        if (statementReader.AtStatementBoundary(&reader))
        {
            dumpFunction->PrintStatementSourceLine(statementIndex);
            statementIndex = statementReader.MoveNextStatementBoundary();
        }
        Output::Print(_u("\n"));
        Output::Flush();
    }